

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string bzr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_revno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_info;
  OutputLogger rerr;
  OutputLogger ierr;
  RevnoParser rout;
  InfoParser iout;
  long *local_860;
  long local_858;
  long local_850 [2];
  string local_840;
  string local_820;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  OutputLogger local_7d0;
  OutputLogger local_790;
  undefined1 local_750 [32];
  long *local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728 [36];
  char *local_4e8;
  undefined1 local_4d8 [32];
  long *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0 [36];
  char *local_268;
  char *local_38;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_860 = local_850;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_860,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_4d8._0_8_ = local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,local_860,local_858 + (long)local_860);
  plVar3 = (long *)(local_4b0[0]._M_local_buf + 8);
  local_4b8 = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"info","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_4d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_7e8,__l,(allocator_type *)local_750);
  lVar2 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  InfoParser::InfoParser((InfoParser *)local_4d8,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_790,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  local_820._M_string_length = 0;
  local_820.field_2._M_local_buf[0] = '\0';
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_7e8,(OutputParser *)local_4d8,
                      (OutputParser *)&local_790,&local_820,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,
                    CONCAT71(local_820.field_2._M_allocated_capacity._1_7_,
                             local_820.field_2._M_local_buf[0]) + 1);
  }
  local_750._0_8_ = local_750 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_750,local_860,local_858 + (long)local_860);
  plVar3 = (long *)(local_728[0]._M_local_buf + 8);
  local_730 = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"revno","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_750;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_800,__l_00,(allocator_type *)&local_7d0);
  lVar2 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  RevnoParser::RevnoParser((RevnoParser *)local_750,this,"revno-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_7d0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"revno-err> ");
  local_840._M_string_length = 0;
  local_840.field_2._M_local_buf[0] = '\0';
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_800,(OutputParser *)local_750,
                      (OutputParser *)&local_7d0,&local_840,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,
                    CONCAT71(local_840.field_2._M_allocated_capacity._1_7_,
                             local_840.field_2._M_local_buf[0]) + 1);
  }
  local_7d0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.super_LineParser.Line._M_dataplus._M_p !=
      &local_7d0.super_LineParser.Line.field_2) {
    operator_delete(local_7d0.super_LineParser.Line._M_dataplus._M_p,
                    local_7d0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_750._0_8_ = &PTR__RevnoParser_00b1d738;
  if (local_4e8 != (char *)0x0) {
    operator_delete__(local_4e8);
  }
  local_750._0_8_ = &PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._24_8_ != local_728) {
    operator_delete((void *)local_750._24_8_,local_728[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_800);
  local_790.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.super_LineParser.Line._M_dataplus._M_p !=
      &local_790.super_LineParser.Line.field_2) {
    operator_delete(local_790.super_LineParser.Line._M_dataplus._M_p,
                    local_790.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_4d8._0_8_ = &PTR__InfoParser_00b1d6f0;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  if (local_268 != (char *)0x0) {
    operator_delete__(local_268);
  }
  local_4d8._0_8_ = &PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._24_8_ != local_4b0) {
    operator_delete((void *)local_4d8._24_8_,local_4b0[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7e8);
  if (local_860 != local_850) {
    operator_delete(local_860,local_850[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_info = { bzr, "info" };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  std::vector<std::string> bzr_revno = { bzr, "revno" };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}